

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall dxil_spv::Converter::Impl::push_ags_instruction(Impl *this,CallInst *instruction)

{
  bool bVar1;
  AgsInstruction *pAVar2;
  AgsInstruction AVar3;
  undefined8 local_38;
  uint32_t local_30;
  uint32_t local_28;
  uint uStack_24;
  AgsInstruction inst;
  uint32_t op;
  CallInst *instruction_local;
  Impl *this_local;
  
  inst.phase = 0;
  unique0x1000029a = instruction;
  bVar1 = get_constant_operand(&instruction->super_Instruction,2,&inst.phase);
  if ((bVar1) && (bVar1 = is_ags_magic(inst.phase), bVar1)) {
    AVar3 = decode_ags_instruction(inst.phase);
    local_30 = AVar3.immediate;
    inst.opcode = local_30;
    local_38 = AVar3._0_8_;
    local_28 = AVar3.opcode;
    if ((local_28 - 0x28 < 3) || (local_28 - 0x2d < 7)) {
      (this->shader_analysis).require_subgroups = true;
      (this->shader_analysis).require_wmma = true;
    }
    uStack_24 = AVar3.phase;
    if ((uStack_24 < (this->ags).current_phase) ||
       (((this->ags).num_instructions != 0 && (local_28 != (this->ags).instructions[0].opcode)))) {
      anon_struct_528_14_18f0960e_for_ags::reset(&this->ags);
    }
    if ((((uStack_24 == (this->ags).current_phase) || (uStack_24 == (this->ags).current_phase + 1))
        && (uStack_24 <= (this->ags).num_instructions)) && ((this->ags).num_instructions < 0x15)) {
      pAVar2 = (this->ags).instructions + (this->ags).num_instructions;
      pAVar2->opcode = (undefined4)local_38;
      pAVar2->phase = local_38._4_4_;
      pAVar2->immediate = inst.opcode;
      (this->ags).backdoor_instructions[(this->ags).num_instructions] = stack0xffffffffffffffe8;
      (this->ags).num_instructions = (this->ags).num_instructions + 1;
      (this->ags).current_phase = uStack_24;
    }
  }
  return;
}

Assistant:

void Converter::Impl::push_ags_instruction(const llvm::CallInst *instruction)
{
	uint32_t op = 0;
	if (!get_constant_operand(instruction, 2, &op))
		return;

	if (!is_ags_magic(op))
		return;

	auto inst = decode_ags_instruction(op);

	switch (inst.opcode)
	{
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavStore:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixCopy:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsStore:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixMulAcc:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixFill:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementFill:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLength:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementExtract:
		shader_analysis.require_subgroups = true;
		shader_analysis.require_wmma = true;
		break;
	}

	// Reset if we're beginning a new instruction sequence.
	// New instruction type, reset.
	if (inst.phase < ags.current_phase ||
	    (ags.num_instructions && inst.opcode != ags.instructions[0].opcode))
	{
		ags.reset();
	}

	if ((inst.phase == ags.current_phase || (inst.phase == ags.current_phase + 1)) &&
	    inst.phase <= ags.num_instructions &&
	    ags.num_instructions < AgsInstruction::MaxInstructions)
	{
		ags.instructions[ags.num_instructions] = inst;
		ags.backdoor_instructions[ags.num_instructions] = instruction;
		ags.num_instructions++;
		ags.current_phase = inst.phase;
	}
}